

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insertCodePoint
          (NumberStringBuilder *this,int32_t index,UChar32 codePoint,Field field,UErrorCode *status)

{
  UBool UVar1;
  int count_00;
  int32_t iVar2;
  char16_t *pcVar3;
  Field *pFVar4;
  int32_t position;
  int32_t count;
  UErrorCode *status_local;
  Field field_local;
  UChar32 codePoint_local;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  count_00 = 2;
  if ((uint)codePoint < 0x10000) {
    count_00 = 1;
  }
  iVar2 = prepareForInsert(this,index,count_00,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (count_00 == 1) {
      pcVar3 = getCharPtr(this);
      pcVar3[iVar2] = (char16_t)codePoint;
      pFVar4 = getFieldPtr(this);
      pFVar4[iVar2] = field;
    }
    else {
      pcVar3 = getCharPtr(this);
      pcVar3[iVar2] = (short)(codePoint >> 10) + L'ퟀ';
      pcVar3 = getCharPtr(this);
      pcVar3[iVar2 + 1] = (char16_t)codePoint & 0x3ffU | 0xdc00;
      pFVar4 = getFieldPtr(this);
      pFVar4[iVar2 + 1] = field;
      pFVar4 = getFieldPtr(this);
      pFVar4[iVar2] = field;
    }
  }
  return count_00;
}

Assistant:

int32_t
NumberStringBuilder::insertCodePoint(int32_t index, UChar32 codePoint, Field field, UErrorCode &status) {
    int32_t count = U16_LENGTH(codePoint);
    int32_t position = prepareForInsert(index, count, status);
    if (U_FAILURE(status)) {
        return count;
    }
    if (count == 1) {
        getCharPtr()[position] = (char16_t) codePoint;
        getFieldPtr()[position] = field;
    } else {
        getCharPtr()[position] = U16_LEAD(codePoint);
        getCharPtr()[position + 1] = U16_TRAIL(codePoint);
        getFieldPtr()[position] = getFieldPtr()[position + 1] = field;
    }
    return count;
}